

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateFrameworkMethods
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  mapped_type *this_00;
  FieldDescriptor *pFVar4;
  FieldGeneratorBase *pFVar5;
  pointer pFVar6;
  OneofDescriptor *pOVar7;
  string *psVar8;
  string local_108;
  int local_e4;
  int i_3;
  unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  generator_1;
  undefined1 local_d0 [4];
  int i_2;
  int local_ac;
  int i_1;
  unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  generator;
  int i;
  string local_68;
  undefined1 local_48 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_48);
  class_name_abi_cxx11_(&local_68,this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&i,"class_name",
             (allocator *)
             ((long)&generator._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                     .
                     super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>
                     ._M_head_impl + 7));
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_48,(key_type *)&i);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_68);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&generator._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                     .
                     super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>
                     ._M_head_impl + 7));
  std::__cxx11::string::~string((string *)&local_68);
  SourceGeneratorBase::WriteGeneratedCodeAttributes
            (&this->super_SourceGeneratorBase,
             (Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  io::Printer::Print((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_48,
                     "public override bool Equals(object other) {\n  return Equals(other as $class_name$);\n}\n\n"
                    );
  SourceGeneratorBase::WriteGeneratedCodeAttributes
            (&this->super_SourceGeneratorBase,
             (Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  io::Printer::Print((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_48,
                     "public bool Equals($class_name$ other) {\n  if (ReferenceEquals(other, null)) {\n    return false;\n  }\n  if (ReferenceEquals(other, this)) {\n    return true;\n  }\n"
                    );
  io::Printer::Indent((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  generator._M_t.
  super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  .super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>.
  _M_head_impl._0_4_ = 0;
  while( true ) {
    iVar1 = (int)generator._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>
                 ._M_head_impl;
    iVar3 = Descriptor::field_count(this->descriptor_);
    if (iVar3 <= iVar1) break;
    pFVar4 = Descriptor::field(this->descriptor_,
                               (int)generator._M_t.
                                    super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                                    .
                                    super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>
                                    ._M_head_impl);
    pFVar5 = CreateFieldGeneratorInternal(this,pFVar4);
    std::
    unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>>
    ::unique_ptr<std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>,void>
              ((unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>>
                *)&stack0xffffffffffffff58,pFVar5);
    pFVar6 = std::
             unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
             ::operator->((unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                           *)&stack0xffffffffffffff58);
    (*(pFVar6->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[0xe])
              (pFVar6,vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
    ::~unique_ptr((unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                   *)&stack0xffffffffffffff58);
    generator._M_t.
    super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
    .super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>.
    _M_head_impl._0_4_ =
         (int)generator._M_t.
              super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
              .
              super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>
              ._M_head_impl + 1;
  }
  local_ac = 0;
  while( true ) {
    iVar1 = local_ac;
    iVar3 = Descriptor::real_oneof_decl_count(this->descriptor_);
    sVar2 = vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (iVar3 <= iVar1) break;
    pOVar7 = Descriptor::oneof_decl(this->descriptor_,local_ac);
    psVar8 = OneofDescriptor::name_abi_cxx11_(pOVar7);
    UnderscoresToCamelCase((string *)local_d0,psVar8,true);
    io::Printer::Print<char[14],std::__cxx11::string>
              ((Printer *)sVar2,
               "if ($property_name$Case != other.$property_name$Case) return false;\n",
               (char (*) [14])0x78fb0a,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
    std::__cxx11::string::~string((string *)local_d0);
    local_ac = local_ac + 1;
  }
  if ((this->has_extension_ranges_ & 1U) != 0) {
    io::Printer::Print<>
              ((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
               "if (!Equals(_extensions, other._extensions)) {\n  return false;\n}\n");
  }
  io::Printer::Outdent((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  io::Printer::Print<>
            ((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
             "  return Equals(_unknownFields, other._unknownFields);\n}\n\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes
            (&this->super_SourceGeneratorBase,
             (Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  io::Printer::Print<>
            ((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
             "public override int GetHashCode() {\n  int hash = 1;\n");
  io::Printer::Indent((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  generator_1._M_t.
  super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  .super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>.
  _M_head_impl._4_4_ = 0;
  while( true ) {
    iVar1 = generator_1._M_t.
            super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
            .super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>.
            _M_head_impl._4_4_;
    iVar3 = Descriptor::field_count(this->descriptor_);
    if (iVar3 <= iVar1) break;
    pFVar4 = Descriptor::field(this->descriptor_,
                               generator_1._M_t.
                               super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                               .
                               super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>
                               ._M_head_impl._4_4_);
    pFVar5 = CreateFieldGeneratorInternal(this,pFVar4);
    std::
    unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>>
    ::unique_ptr<std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>,void>
              ((unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>>
                *)&stack0xffffffffffffff20,pFVar5);
    pFVar6 = std::
             unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
             ::operator->((unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                           *)&stack0xffffffffffffff20);
    (*(pFVar6->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[0xd])
              (pFVar6,vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
    ::~unique_ptr((unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                   *)&stack0xffffffffffffff20);
    generator_1._M_t.
    super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
    .super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>.
    _M_head_impl._4_4_ =
         generator_1._M_t.
         super___uniq_ptr_impl<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
         ._M_t.
         super__Tuple_impl<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
         .super__Head_base<0UL,_google::protobuf::compiler::csharp::FieldGeneratorBase_*,_false>.
         _M_head_impl._4_4_ + 1;
  }
  local_e4 = 0;
  while( true ) {
    iVar1 = local_e4;
    iVar3 = Descriptor::real_oneof_decl_count(this->descriptor_);
    sVar2 = vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (iVar3 <= iVar1) break;
    pOVar7 = Descriptor::oneof_decl(this->descriptor_,local_e4);
    psVar8 = OneofDescriptor::name_abi_cxx11_(pOVar7);
    UnderscoresToCamelCase(&local_108,psVar8,false);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)sVar2,"hash ^= (int) $name$Case_;\n",(char (*) [5])0x77db8d,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    local_e4 = local_e4 + 1;
  }
  if ((this->has_extension_ranges_ & 1U) != 0) {
    io::Printer::Print<>
              ((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
               "if (_extensions != null) {\n  hash ^= _extensions.GetHashCode();\n}\n");
  }
  io::Printer::Print<>
            ((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
             "if (_unknownFields != null) {\n  hash ^= _unknownFields.GetHashCode();\n}\nreturn hash;\n"
            );
  io::Printer::Outdent((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  io::Printer::Print<>((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,"}\n\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes
            (&this->super_SourceGeneratorBase,
             (Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  io::Printer::Print<>
            ((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
             "public override string ToString() {\n  return pb::JsonFormatter.ToDiagnosticString(this);\n}\n\n"
            );
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_48);
  return;
}

Assistant:

void MessageGenerator::GenerateFrameworkMethods(io::Printer* printer) {
    std::map<std::string, std::string> vars;
    vars["class_name"] = class_name();

    // Equality
    WriteGeneratedCodeAttributes(printer);
    printer->Print(
        vars,
        "public override bool Equals(object other) {\n"
        "  return Equals(other as $class_name$);\n"
        "}\n\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print(
        vars,
        "public bool Equals($class_name$ other) {\n"
        "  if (ReferenceEquals(other, null)) {\n"
        "    return false;\n"
        "  }\n"
        "  if (ReferenceEquals(other, this)) {\n"
        "    return true;\n"
        "  }\n");
    printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); i++) {
      std::unique_ptr<FieldGeneratorBase> generator(
            CreateFieldGeneratorInternal(descriptor_->field(i)));
        generator->WriteEquals(printer);
    }
    for (int i = 0; i < descriptor_->real_oneof_decl_count(); i++) {
      printer->Print("if ($property_name$Case != other.$property_name$Case) return false;\n",
          "property_name", UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), true));
    }
    if (has_extension_ranges_) {
      printer->Print(
          "if (!Equals(_extensions, other._extensions)) {\n"
          "  return false;\n"
          "}\n");
    }
    printer->Outdent();
    printer->Print(
        "  return Equals(_unknownFields, other._unknownFields);\n"
        "}\n\n");

    // GetHashCode
    // Start with a non-zero value to easily distinguish between null and "empty" messages.
    WriteGeneratedCodeAttributes(printer);
    printer->Print(
        "public override int GetHashCode() {\n"
        "  int hash = 1;\n");
    printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); i++) {
      std::unique_ptr<FieldGeneratorBase> generator(
            CreateFieldGeneratorInternal(descriptor_->field(i)));
        generator->WriteHash(printer);
    }
    for (int i = 0; i < descriptor_->real_oneof_decl_count(); i++) {
      printer->Print("hash ^= (int) $name$Case_;\n",
          "name", UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), false));
    }
    if (has_extension_ranges_) {
      printer->Print(
        "if (_extensions != null) {\n"
        "  hash ^= _extensions.GetHashCode();\n"
        "}\n");
    }
    printer->Print(
        "if (_unknownFields != null) {\n"
        "  hash ^= _unknownFields.GetHashCode();\n"
        "}\n"
        "return hash;\n");
    printer->Outdent();
    printer->Print("}\n\n");

    WriteGeneratedCodeAttributes(printer);
    printer->Print(
        "public override string ToString() {\n"
        "  return pb::JsonFormatter.ToDiagnosticString(this);\n"
        "}\n\n");
}